

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageOptions_UnrecognizedElectiveOption_Test::
~CoapTest_CoapMessageOptions_UnrecognizedElectiveOption_Test
          (CoapTest_CoapMessageOptions_UnrecognizedElectiveOption_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_UnrecognizedElectiveOption)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00, 0xc3, 0x11, 0x22, 0x33};
    Error     error;

    auto message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);
    EXPECT_EQ(message->GetOptionNum(), 0);
}